

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

string * __thiscall
duckdb::Exception::ConstructMessageRecursive<std::__cxx11::string,char_const*,std::__cxx11::string>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
          *values,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param,
          char *params,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1)

{
  string *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_00;
  string asStack_a8 [32];
  undefined1 local_88 [56];
  string local_50 [32];
  
  params_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)params;
  ::std::__cxx11::string::string((string *)local_88,(string *)values);
  ExceptionFormatValue::CreateFormatValue<std::__cxx11::string>
            ((ExceptionFormatValue *)(local_88 + 0x20),(ExceptionFormatValue *)local_88,value);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  emplace_back<duckdb::ExceptionFormatValue>
            ((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             msg,(ExceptionFormatValue *)(local_88 + 0x20));
  ::std::__cxx11::string::~string(local_50);
  ::std::__cxx11::string::~string((string *)local_88);
  ::std::__cxx11::string::string(asStack_a8,(string *)params);
  ConstructMessageRecursive<char_const*,std::__cxx11::string>
            (__return_storage_ptr__,this,msg,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             param,(char *)asStack_a8,params_00);
  ::std::__cxx11::string::~string(asStack_a8);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}